

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O0

uint zvgEcpPutMem(uchar *mem,uint memSize)

{
  uint local_18;
  uint local_14;
  uint err;
  uint memSize_local;
  uchar *mem_local;
  
  local_18 = 0;
  local_14 = memSize;
  _err = mem;
  while ((local_14 != 0 && (local_18 = zvgEcpPutc(*_err), local_18 == 0))) {
    _err = _err + 1;
    local_14 = local_14 - 1;
  }
  return local_18;
}

Assistant:

uint zvgEcpPutMem( uchar *mem, uint memSize)
{
	uint	err;

	err = errOk;

	while (memSize-- > 0)
	{
		err = zvgEcpPutc( *mem);

		if (err)
			break;

		else
			mem++;
	}
	return (err);
}